

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O1

int generateCombinatorialStabil
              (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Vec_Int_t *vCandidateMonotoneSignals_,
              Vec_Ptr_t *vDisj_nCk_,int combN,int combK)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  Vec_Int_t *p;
  int *piVar6;
  ulong uVar7;
  void **ppvVar8;
  long lVar9;
  int iVar10;
  Aig_Obj_t *p0;
  int iVar11;
  Aig_Obj_t *p1;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < combK + 2U) {
    iVar11 = combK + 3;
  }
  p->nSize = 0;
  p->nCap = iVar11;
  if (iVar11 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar11 << 2);
  }
  p->pArray = piVar6;
  if (-1 < combK) {
    iVar11 = -1;
    do {
      Vec_IntPush(p,iVar11);
      iVar11 = iVar11 + 1;
    } while (combK != iVar11);
  }
  Vec_IntPush(p,combN);
  iVar11 = 0;
  Vec_IntPush(p,0);
  do {
    p1 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
    if (0 < combK) {
      iVar10 = p->nSize;
      uVar5 = combK;
      do {
        if (iVar10 <= combK) goto LAB_005918f5;
        iVar1 = p->pArray[uVar5];
        if (((long)iVar1 < 0) || (vCandidateMonotoneSignals_->nSize <= iVar1)) goto LAB_005918f5;
        iVar1 = vCandidateMonotoneSignals_->pArray[iVar1];
        if (((long)iVar1 < 0) || (pAigOld->vCos->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = pAigOld->vCos->pArray[iVar1];
        if (((ulong)pvVar2 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar3 = *(ulong *)((long)pvVar2 + 8);
        uVar7 = uVar3 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          p0 = (Aig_Obj_t *)0x0;
        }
        else {
          p0 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        p1 = Aig_Or(pAigNew,p0,p1);
        bVar4 = 1 < (int)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar4);
    }
    uVar5 = vDisj_nCk_->nCap;
    if (vDisj_nCk_->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vDisj_nCk_->pArray == (void **)0x0) {
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(vDisj_nCk_->pArray,0x80);
        }
        vDisj_nCk_->pArray = ppvVar8;
        iVar10 = 0x10;
      }
      else {
        iVar10 = uVar5 * 2;
        if (iVar10 <= (int)uVar5) goto LAB_0059186a;
        if (vDisj_nCk_->pArray == (void **)0x0) {
          ppvVar8 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar8 = (void **)realloc(vDisj_nCk_->pArray,(ulong)uVar5 << 4);
        }
        vDisj_nCk_->pArray = ppvVar8;
      }
      vDisj_nCk_->nCap = iVar10;
    }
LAB_0059186a:
    iVar10 = vDisj_nCk_->nSize;
    vDisj_nCk_->nSize = iVar10 + 1;
    vDisj_nCk_->pArray[iVar10] = p1;
    if ((p->nSize < 2) || (uVar5 = p->nSize - 1, uVar5 == 1)) {
LAB_005918f5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar11 = iVar11 + 1;
    piVar6 = p->pArray;
    lVar9 = 0;
    while( true ) {
      if (piVar6[lVar9 + 1] + 1 != piVar6[lVar9 + 2]) break;
      piVar6[lVar9 + 1] = (int)lVar9;
      lVar9 = lVar9 + 1;
      if ((ulong)uVar5 - 1 == lVar9) goto LAB_005918f5;
    }
    if (combK < (int)lVar9 + 1) {
      if (piVar6 != (int *)0x0) {
        free(piVar6);
        p->pArray = (int *)0x0;
      }
      free(p);
      return iVar11;
    }
    piVar6[lVar9 + 1] = piVar6[lVar9 + 1] + 1;
  } while( true );
}

Assistant:

int generateCombinatorialStabil( Aig_Man_t *pAigNew, Aig_Man_t *pAigOld, 
				Vec_Int_t *vCandidateMonotoneSignals_,
				Vec_Ptr_t *vDisj_nCk_,
				int combN, int combK )
{
	Aig_Obj_t *pObjMonoCand, *pObj;
	int targetPoIndex;

	//Knuth's Data Strcuture
	int totalCombination_KNUTH = 0;
	Vec_Int_t *vC_KNUTH;
	int i_KNUTH, j_KNUTH;

	//Knuth's Data Structure Initialization
	vC_KNUTH = Vec_IntAlloc(combK+3);
	for(i_KNUTH=-1; i_KNUTH<combK; i_KNUTH++)
		Vec_IntPush( vC_KNUTH, i_KNUTH );
	Vec_IntPush( vC_KNUTH, combN );
	Vec_IntPush( vC_KNUTH, 0 );

	while(1)
	{
		totalCombination_KNUTH++;
		pObjMonoCand = Aig_Not(Aig_ManConst1(pAigNew));
		for( i_KNUTH=combK; i_KNUTH>0; i_KNUTH--)
		{
			targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals_, Vec_IntEntry(vC_KNUTH, i_KNUTH));
			pObj = Aig_ObjChild0Copy(Aig_ManCo( pAigOld, targetPoIndex ));
			pObjMonoCand = Aig_Or( pAigNew, pObj, pObjMonoCand );
		}
		Vec_PtrPush(vDisj_nCk_, pObjMonoCand );

		j_KNUTH = 1;
		while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
		{
			Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
			j_KNUTH = j_KNUTH + 1;
		}
		if( j_KNUTH > combK ) break;
		Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
	}

	Vec_IntFree(vC_KNUTH);

	return totalCombination_KNUTH;
}